

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::AssetPath> *this,double t)

{
  undefined1 local_68 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<tinyusdz::value::AssetPath> *this_local;
  
  s._72_8_ = t;
  Sample::Sample((Sample *)local_68);
  local_68 = (undefined1  [8])s._72_8_;
  s.value.resolved_path_.field_2._M_local_buf[8] = '\x01';
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
              *)this,(Sample *)local_68);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_68);
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }